

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

size_t ZSTD_entropyCompressSeqStore
                 (seqStore_t *seqStorePtr,ZSTD_entropyCTables_t *prevEntropy,
                 ZSTD_entropyCTables_t *nextEntropy,ZSTD_CCtx_params *cctxParams,void *dst,
                 size_t dstCapacity,size_t srcSize,void *entropyWorkspace,size_t entropyWkspSize,
                 int bmi2)

{
  uint uVar1;
  size_t sVar2;
  size_t maxCSize;
  size_t err_code;
  size_t cSize;
  size_t dstCapacity_local;
  void *dst_local;
  ZSTD_CCtx_params *cctxParams_local;
  ZSTD_entropyCTables_t *nextEntropy_local;
  ZSTD_entropyCTables_t *prevEntropy_local;
  seqStore_t *seqStorePtr_local;
  
  seqStorePtr_local =
       (seqStore_t *)
       ZSTD_entropyCompressSeqStore_internal
                 (seqStorePtr,prevEntropy,nextEntropy,cctxParams,dst,dstCapacity,entropyWorkspace,
                  entropyWkspSize,bmi2);
  if (seqStorePtr_local == (seqStore_t *)0x0) {
    seqStorePtr_local = (seqStore_t *)0x0;
  }
  else if (seqStorePtr_local == (seqStore_t *)0xffffffffffffffba && srcSize <= dstCapacity) {
    seqStorePtr_local = (seqStore_t *)0x0;
  }
  else {
    uVar1 = ERR_isError((size_t)seqStorePtr_local);
    if ((uVar1 == 0) &&
       (sVar2 = ZSTD_minGain(srcSize,(cctxParams->cParams).strategy),
       (seqStore_t *)(srcSize - sVar2) <= seqStorePtr_local)) {
      seqStorePtr_local = (seqStore_t *)0x0;
    }
  }
  return (size_t)seqStorePtr_local;
}

Assistant:

MEM_STATIC size_t
ZSTD_entropyCompressSeqStore(seqStore_t* seqStorePtr,
                       const ZSTD_entropyCTables_t* prevEntropy,
                             ZSTD_entropyCTables_t* nextEntropy,
                       const ZSTD_CCtx_params* cctxParams,
                             void* dst, size_t dstCapacity,
                             size_t srcSize,
                             void* entropyWorkspace, size_t entropyWkspSize,
                             int bmi2)
{
    size_t const cSize = ZSTD_entropyCompressSeqStore_internal(
                            seqStorePtr, prevEntropy, nextEntropy, cctxParams,
                            dst, dstCapacity,
                            entropyWorkspace, entropyWkspSize, bmi2);
    if (cSize == 0) return 0;
    /* When srcSize <= dstCapacity, there is enough space to write a raw uncompressed block.
     * Since we ran out of space, block must be not compressible, so fall back to raw uncompressed block.
     */
    if ((cSize == ERROR(dstSize_tooSmall)) & (srcSize <= dstCapacity))
        return 0;  /* block not compressed */
    FORWARD_IF_ERROR(cSize, "ZSTD_entropyCompressSeqStore_internal failed");

    /* Check compressibility */
    {   size_t const maxCSize = srcSize - ZSTD_minGain(srcSize, cctxParams->cParams.strategy);
        if (cSize >= maxCSize) return 0;  /* block not compressed */
    }
    DEBUGLOG(4, "ZSTD_entropyCompressSeqStore() cSize: %zu", cSize);
    return cSize;
}